

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O3

Cut_Oracle_t * Cut_OracleStart(Cut_Man_t *pMan)

{
  int iVar1;
  uint uVar2;
  Cut_Params_t *pCVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Cut_Oracle_t *pCVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  ulong uVar9;
  Extra_MmFixed_t *pEVar10;
  int iVar11;
  size_t __size;
  uint uVar12;
  
  pCVar3 = pMan->pParams;
  iVar1 = pCVar3->nVarsMax;
  if (9 < iVar1 - 3U) {
    __assert_fail("pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutOracle.c"
                  ,0x4d,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
  }
  if (pCVar3->fRecord == 0) {
    __assert_fail("pMan->pParams->fRecord",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutOracle.c"
                  ,0x4e,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
  }
  pCVar6 = (Cut_Oracle_t *)calloc(1,0x68);
  pCVar6->pParams = pCVar3;
  pVVar4 = pMan->vNodeCuts;
  pVVar5 = pMan->vNodeStarts;
  pMan->vNodeCuts = (Vec_Int_t *)0x0;
  pCVar6->vNodeCuts = pVVar4;
  pCVar6->vNodeStarts = pVVar5;
  pMan->vNodeStarts = (Vec_Int_t *)0x0;
  pCVar6->vCutPairs = pMan->vCutPairs;
  pMan->vCutPairs = (Vec_Int_t *)0x0;
  uVar2 = pCVar3->nIdsMax;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar2 - 1) {
    uVar12 = uVar2;
  }
  pVVar7->nCap = uVar12;
  if (uVar12 == 0) {
    pVVar7->pArray = (void **)0x0;
    pCVar6->vCutsNew = pVVar7;
    if ((int)uVar2 < 1) goto LAB_0043d8f7;
    __size = (ulong)uVar2 * 8;
LAB_0043d8cd:
    ppvVar8 = (void **)malloc(__size);
LAB_0043d8d5:
    pVVar7->pArray = ppvVar8;
    pVVar7->nCap = uVar2;
  }
  else {
    ppvVar8 = (void **)malloc((long)(int)uVar12 << 3);
    pVVar7->pArray = ppvVar8;
    pCVar6->vCutsNew = pVVar7;
    if ((int)uVar12 < (int)uVar2) {
      __size = (long)(int)uVar2 << 3;
      if (ppvVar8 == (void **)0x0) goto LAB_0043d8cd;
      ppvVar8 = (void **)realloc(ppvVar8,__size);
      goto LAB_0043d8d5;
    }
  }
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      pVVar7->pArray[uVar9] = (void *)0x0;
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
LAB_0043d8f7:
  pVVar7->nSize = uVar2;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  pCVar6->vCuts0 = pVVar7;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  pCVar6->vCuts1 = pVVar7;
  iVar11 = iVar1 * 4 + 0x18;
  pCVar6->EntrySize = iVar11;
  if (pCVar3->fTruth != 0) {
    if (iVar1 < 9) {
      iVar11 = 1 << ((char)iVar1 - 5U & 0x1f);
      if (iVar1 < 6) {
        iVar11 = 1;
      }
      pCVar6->nTruthWords = iVar11;
      iVar11 = (iVar11 + iVar1) * 4 + 0x18;
      pCVar6->EntrySize = iVar11;
    }
    else {
      pCVar3->fTruth = 0;
      puts("Skipping computation of truth table for more than 8 inputs.");
    }
  }
  pEVar10 = Extra_MmFixedStart(iVar11);
  pCVar6->pMmCuts = pEVar10;
  return pCVar6;
}

Assistant:

Cut_Oracle_t * Cut_OracleStart( Cut_Man_t * pMan )
{
    Cut_Oracle_t * p;

    assert( pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX );
    assert( pMan->pParams->fRecord );

    p = ABC_ALLOC( Cut_Oracle_t, 1 );
    memset( p, 0, sizeof(Cut_Oracle_t) );

    // set and correct parameters
    p->pParams     = pMan->pParams;

    // transfer the recording info
    p->vNodeCuts   = pMan->vNodeCuts;    pMan->vNodeCuts   = NULL;
    p->vNodeStarts = pMan->vNodeStarts;  pMan->vNodeStarts = NULL;
    p->vCutPairs   = pMan->vCutPairs;    pMan->vCutPairs   = NULL;

    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( p->pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, p->pParams->nIdsMax, NULL );
    p->vCuts0 = Vec_PtrAlloc( 100 );
    p->vCuts1 = Vec_PtrAlloc( 100 );

    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + p->pParams->nVarsMax * sizeof(int);
    if ( p->pParams->fTruth )
    {
        if ( p->pParams->nVarsMax > 8 )
        {
            p->pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than 8 inputs.\n" );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( p->pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    return p;
}